

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O0

void __thiscall
TTD::ExecutionInfoManager::GetLastExceptionTimeAndPositionForDebugger
          (ExecutionInfoManager *this,TTDebuggerSourceLocation *sourceLocation)

{
  TTDebuggerSourceLocation *sourceLocation_local;
  ExecutionInfoManager *this_local;
  
  TTDebuggerSourceLocation::SetLocationCopy(sourceLocation,&this->m_lastExceptionLocation);
  return;
}

Assistant:

void ExecutionInfoManager::GetLastExceptionTimeAndPositionForDebugger(TTDebuggerSourceLocation& sourceLocation) const
    {
        //If no exception then this will also clear sourceLocation
        sourceLocation.SetLocationCopy(this->m_lastExceptionLocation);
    }